

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ons.cc
# Opt level: O0

Ons * aliyun::Ons::CreateOnsClient(string *endpoint,string *appid,string *secret)

{
  ulong uVar1;
  string local_100;
  string local_e0;
  string local_c0;
  undefined4 local_a0;
  allocator<char> local_89;
  string local_88;
  string local_68;
  undefined1 local_48 [8];
  string host_name;
  string *secret_local;
  string *appid_local;
  string *endpoint_local;
  
  host_name.field_2._8_8_ = secret;
  std::__cxx11::string::string((string *)&local_68,(string *)endpoint);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Ons",&local_89);
  AliGetEndpointHost((string *)local_48,&local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_68);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    endpoint_local = (string *)operator_new(0x38);
    std::__cxx11::string::string((string *)&local_c0,(string *)local_48);
    std::__cxx11::string::string((string *)&local_e0,(string *)appid);
    std::__cxx11::string::string((string *)&local_100,(string *)secret);
    Ons((Ons *)endpoint_local,&local_c0,&local_e0,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  else {
    endpoint_local = (string *)0x0;
  }
  local_a0 = 1;
  std::__cxx11::string::~string((string *)local_48);
  return (Ons *)endpoint_local;
}

Assistant:

Ons* Ons::CreateOnsClient(std::string endpoint, std::string appid, std::string secret) {
    std::string host_name = AliGetEndpointHost(endpoint, "Ons");
    if(host_name.empty()) {
      return NULL;
    }
    return new Ons(host_name, appid, secret);
  }